

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O2

bool printSymbolizedStackTrace(StringRef Argv0,void **StackTrace,int Depth,raw_ostream *OS)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  string *MainAddr;
  ulong in_R9;
  StringRef Name;
  StringRef Str;
  StringRef path;
  ArrayRef<llvm::StringRef> Paths;
  allocator_type local_111;
  StringRef Argv0_local;
  value_type_conflict6 local_100;
  string MainExecutableName;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LLVMSymbolizerPathOrErr;
  vector<long,_std::allocator<long>_> Offsets;
  BumpPtrAllocator Allocator;
  vector<const_char_*,_std::allocator<const_char_*>_> Modules;
  
  Argv0_local.Length = Argv0.Length;
  Argv0_local.Data = Argv0.Data;
  MainAddr = (string *)0x0;
  Str.Length = 0xf;
  Str.Data = "llvm-symbolizer";
  sVar3 = llvm::StringRef::find(&Argv0_local,Str,0);
  if (sVar3 == 0xffffffffffffffff) {
    uVar4 = std::_V2::system_category();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    llvm::ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::ErrorOr(&LLVMSymbolizerPathOrErr,(error_code)(auVar1 << 0x40));
    if (Argv0_local.Length != 0) {
      path.Length = 2;
      path.Data = (char *)Argv0_local.Length;
      MainExecutableName._0_16_ =
           llvm::sys::path::parent_path((path *)Argv0_local.Data,path,(Style)MainAddr);
      if (MainExecutableName._M_string_length != 0) {
        MainAddr = &MainExecutableName;
        Name.Length = (size_t)MainAddr;
        Name.Data = (char *)0xf;
        Paths.Length = in_R9;
        Paths.Data = (StringRef *)0x1;
        llvm::sys::findProgramByName_abi_cxx11_
                  ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&Allocator,(sys *)"llvm-symbolizer",Name,Paths);
        llvm::ErrorOr<std::__cxx11::string>::moveAssign<std::__cxx11::string>
                  ((ErrorOr<std::__cxx11::string> *)&LLVMSymbolizerPathOrErr,
                   (ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&Allocator);
        llvm::
        ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&Allocator);
      }
    }
    if ((LLVMSymbolizerPathOrErr._32_1_ & 1) != 0) {
      MainAddr = (string *)0x0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_R9;
      llvm::sys::findProgramByName_abi_cxx11_
                ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&Allocator,(sys *)"llvm-symbolizer",(StringRef)ZEXT816(0xf),
                 (ArrayRef<llvm::StringRef>)(auVar2 << 0x40));
      llvm::ErrorOr<std::__cxx11::string>::moveAssign<std::__cxx11::string>
                ((ErrorOr<std::__cxx11::string> *)&LLVMSymbolizerPathOrErr,
                 (ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&Allocator);
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&Allocator);
    }
    if ((LLVMSymbolizerPathOrErr._32_1_ & 1) == 0) {
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      getStorage(&LLVMSymbolizerPathOrErr);
      if (Argv0_local.Length == 0) {
        llvm::sys::fs::getMainExecutable_abi_cxx11_
                  (&MainExecutableName,(fs *)0x0,(char *)0x0,MainAddr);
      }
      else {
        llvm::StringRef::str_abi_cxx11_(&MainExecutableName,&Argv0_local);
      }
      Allocator.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX =
           &Allocator.Slabs.super_SmallVectorStorage<void_*,_4U>;
      Allocator.CurPtr = (char *)0x0;
      Allocator.End = (char *)0x0;
      Allocator.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size = 0;
      Allocator.Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Capacity = 4;
      Allocator.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
      BeginX = &Allocator.BytesAllocated;
      Allocator.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
      Size = 0;
      Allocator.CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
      Capacity = 0;
      Allocator.BytesAllocated = 0;
      Allocator.RedZoneSize = 1;
      Offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &Modules.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>,
                 (long)Depth,(value_type *)&Offsets,(allocator_type *)&local_100);
      local_100 = 0;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &Offsets.super__Vector_base<long,_std::allocator<long>_>,(long)Depth,&local_100,
                 &local_111);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&Offsets.super__Vector_base<long,_std::allocator<long>_>);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&Modules.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
                (&Allocator);
      std::__cxx11::string::_M_dispose();
    }
    llvm::ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~ErrorOr(&LLVMSymbolizerPathOrErr);
  }
  return false;
}

Assistant:

LLVM_ATTRIBUTE_USED
static bool printSymbolizedStackTrace(StringRef Argv0, void **StackTrace,
                                      int Depth, llvm::raw_ostream &OS) {
  if (DisableSymbolicationFlag)
    return false;

  // Don't recursively invoke the llvm-symbolizer binary.
  if (Argv0.find("llvm-symbolizer") != std::string::npos)
    return false;

  // FIXME: Subtract necessary number from StackTrace entries to turn return addresses
  // into actual instruction addresses.
  // Use llvm-symbolizer tool to symbolize the stack traces. First look for it
  // alongside our binary, then in $PATH.
  ErrorOr<std::string> LLVMSymbolizerPathOrErr = std::error_code();
  if (!Argv0.empty()) {
    StringRef Parent = llvm::sys::path::parent_path(Argv0);
    if (!Parent.empty())
      LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer", Parent);
  }
  if (!LLVMSymbolizerPathOrErr)
    LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer");
  if (!LLVMSymbolizerPathOrErr)
    return false;
  const std::string &LLVMSymbolizerPath = *LLVMSymbolizerPathOrErr;

  // If we don't know argv0 or the address of main() at this point, try
  // to guess it anyway (it's possible on some platforms).
  std::string MainExecutableName =
      Argv0.empty() ? sys::fs::getMainExecutable(nullptr, nullptr)
                    : (std::string)Argv0;
  BumpPtrAllocator Allocator;
  StringSaver StrPool(Allocator);
  std::vector<const char *> Modules(Depth, nullptr);
  std::vector<intptr_t> Offsets(Depth, 0);
  if (!findModulesAndOffsets(StackTrace, Depth, Modules.data(), Offsets.data(),
                             MainExecutableName.c_str(), StrPool))
    return false;
  int InputFD;
  SmallString<32> InputFile, OutputFile;
  sys::fs::createTemporaryFile("symbolizer-input", "", InputFD, InputFile);
  sys::fs::createTemporaryFile("symbolizer-output", "", OutputFile);
  FileRemover InputRemover(InputFile.c_str());
  FileRemover OutputRemover(OutputFile.c_str());

  {
    raw_fd_ostream Input(InputFD, true);
    for (int i = 0; i < Depth; i++) {
      if (Modules[i])
        Input << Modules[i] << " " << (void*)Offsets[i] << "\n";
    }
  }

  Optional<StringRef> Redirects[] = {StringRef(InputFile),
                                     StringRef(OutputFile), llvm::None};
  StringRef Args[] = {"llvm-symbolizer", "--functions=linkage", "--inlining",
#ifdef _WIN32
                      // Pass --relative-address on Windows so that we don't
                      // have to add ImageBase from PE file.
                      // FIXME: Make this the default for llvm-symbolizer.
                      "--relative-address",
#endif
                      "--demangle"};
  int RunResult =
      sys::ExecuteAndWait(LLVMSymbolizerPath, Args, None, Redirects);
  if (RunResult != 0)
    return false;

  // This report format is based on the sanitizer stack trace printer.  See
  // sanitizer_stacktrace_printer.cc in compiler-rt.
  auto OutputBuf = MemoryBuffer::getFile(OutputFile.c_str());
  if (!OutputBuf)
    return false;
  StringRef Output = OutputBuf.get()->getBuffer();
  SmallVector<StringRef, 32> Lines;
  Output.split(Lines, "\n");
  auto CurLine = Lines.begin();
  int frame_no = 0;
  for (int i = 0; i < Depth; i++) {
    if (!Modules[i]) {
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << '\n';
      continue;
    }
    // Read pairs of lines (function name and file/line info) until we
    // encounter empty line.
    for (;;) {
      if (CurLine == Lines.end())
        return false;
      StringRef FunctionName = *CurLine++;
      if (FunctionName.empty())
        break;
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << ' ';
      if (!FunctionName.startswith("??"))
        OS << FunctionName << ' ';
      if (CurLine == Lines.end())
        return false;
      StringRef FileLineInfo = *CurLine++;
      if (!FileLineInfo.startswith("??"))
        OS << FileLineInfo;
      else
        OS << "(" << Modules[i] << '+' << format_hex(Offsets[i], 0) << ")";
      OS << "\n";
    }
  }
  return true;
}